

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::ExternalCallEventLogEntry_Emit
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  ExternalCallEventLogEntry *pEVar1;
  uint32 i;
  ulong uVar2;
  
  pEVar1 = GetInlineEventDataAs<TTD::NSLogEvents::ExternalCallEventLogEntry,(TTD::NSLogEvents::EventKind)12>
                     (evt);
  FileWriter::WriteString(writer,name,&pEVar1->FunctionName,CommaSeparator);
  FileWriter::WriteInt32(writer,rootNestingDepth,pEVar1->RootNestingDepth,CommaSeparator);
  FileWriter::WriteLengthValue(writer,pEVar1->ArgCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  for (uVar2 = 0; uVar2 < pEVar1->ArgCount; uVar2 = uVar2 + 1) {
    NSSnapValues::EmitTTDVar(pEVar1->ArgArray[uVar2],writer,uVar2 != 0);
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  (*writer->_vptr_FileWriter[3])(writer,0x13,1);
  NSSnapValues::EmitTTDVar(pEVar1->NewTarget,writer,NoSeparator);
  (*writer->_vptr_FileWriter[3])(writer,0x12,1);
  NSSnapValues::EmitTTDVar(pEVar1->ReturnValue,writer,NoSeparator);
  (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)pEVar1->CheckExceptionStatus,1);
  FileWriter::WriteInt64(writer,i64Val,pEVar1->LastNestedEventTime,CommaSeparator);
  return;
}

Assistant:

void ExternalCallEventLogEntry_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const ExternalCallEventLogEntry* callEvt = GetInlineEventDataAs<ExternalCallEventLogEntry, EventKind::ExternalCallTag>(evt);

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            writer->WriteString(NSTokens::Key::name, callEvt->FunctionName, NSTokens::Separator::CommaSeparator);
#endif

            writer->WriteInt32(NSTokens::Key::rootNestingDepth, callEvt->RootNestingDepth, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(callEvt->ArgCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < callEvt->ArgCount; ++i)
            {
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;
                NSSnapValues::EmitTTDVar(callEvt->ArgArray[i], writer, sep);
            }
            writer->WriteSequenceEnd();

            writer->WriteKey(NSTokens::Key::newTargetVal, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(callEvt->NewTarget, writer, NSTokens::Separator::NoSeparator);

            writer->WriteKey(NSTokens::Key::argRetVal, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(callEvt->ReturnValue, writer, NSTokens::Separator::NoSeparator);

            writer->WriteBool(NSTokens::Key::boolVal, callEvt->CheckExceptionStatus, NSTokens::Separator::CommaSeparator);

            writer->WriteInt64(NSTokens::Key::i64Val, callEvt->LastNestedEventTime, NSTokens::Separator::CommaSeparator);
        }